

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

u32 jsonbArrayCount(JsonParse *pParse,u32 iRoot)

{
  uint uVar1;
  u32 in_ESI;
  JsonParse *in_RDI;
  long in_FS_OFFSET;
  u32 k;
  u32 iEnd;
  u32 i;
  u32 n;
  u32 sz;
  u32 local_2c;
  uint local_24;
  u32 local_20;
  u32 local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_c = 0xaaaaaaaa;
  local_2c = 0;
  local_20 = jsonbPayloadSize(in_RDI,in_ESI,&local_c);
  uVar1 = in_ESI + local_20 + local_c;
  for (local_24 = in_ESI + local_20; local_20 != 0 && local_24 < uVar1;
      local_24 = local_c + local_20 + local_24) {
    local_20 = jsonbPayloadSize(in_RDI,local_24,&local_c);
    local_2c = local_2c + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_2c;
  }
  __stack_chk_fail();
}

Assistant:

static u32 jsonbArrayCount(JsonParse *pParse, u32 iRoot){
  u32 n, sz, i, iEnd;
  u32 k = 0;
  n = jsonbPayloadSize(pParse, iRoot, &sz);
  iEnd = iRoot+n+sz;
  for(i=iRoot+n; n>0 && i<iEnd; i+=sz+n, k++){
    n = jsonbPayloadSize(pParse, i, &sz);
  }
  return k;
}